

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  FileOptions *in_stack_ffffffffffffff10;
  
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x674f50);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)0x674f5e);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)0x674f6c);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)0x674f7a);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x674f88);
  RepeatedField<int>::Clear((RepeatedField<int> *)(in_RDI + 0x90));
  RepeatedField<int>::Clear((RepeatedField<int> *)(in_RDI + 0xa0));
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x675013);
    }
    if ((uVar1 & 2) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x675033);
    }
    if ((uVar1 & 4) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x675053);
    }
    if ((uVar1 & 8) != 0) {
      FileOptions::Clear(in_stack_ffffffffffffff10);
    }
    if ((uVar1 & 0x10) != 0) {
      SourceCodeInfo::Clear((SourceCodeInfo *)in_stack_ffffffffffffff10);
    }
  }
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      package_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      syntax_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
    if (cached_has_bits & 0x00000010u) {
      GOOGLE_DCHECK(source_code_info_ != nullptr);
      source_code_info_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}